

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.cpp
# Opt level: O2

void duckdb_brotli::BrotliInitDistanceParams
               (BrotliDistanceParams *dist_params,uint32_t npostfix,uint32_t ndirect,
               int large_window)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  size_t sVar9;
  
  uVar5 = (ulong)ndirect;
  bVar2 = (byte)npostfix;
  dist_params->distance_postfix_bits = npostfix;
  dist_params->num_direct_distance_codes = ndirect;
  uVar7 = 0xffffffff;
  if (large_window == 0) {
    uVar7 = ndirect + (0x18 << (bVar2 + 1 & 0x1f)) + 0x10;
    uVar5 = (ulong)uVar7;
    sVar9 = (size_t)((1 << (bVar2 + 0x1a & 0x1f)) + ndirect + (-1 << (bVar2 + 2 & 0x1f)));
  }
  else {
    if (ndirect < 0x7ffffffc) {
      uVar8 = -1 << (bVar2 & 0x1f);
      iVar3 = -5;
      uVar6 = (0x7ffffffc - ndirect >> (bVar2 & 0x1f)) + 4;
      for (uVar4 = uVar6; 1 < uVar4; uVar4 = uVar4 >> 1) {
        iVar3 = iVar3 + 2;
        uVar7 = uVar7 + 1;
      }
      uVar4 = (uint)((uVar6 >> (uVar7 & 0x1f) & 1) != 0) + iVar3;
      uVar7 = ndirect + 0x10;
      if (uVar4 != 0xffffffff) {
        bVar1 = (byte)(uVar4 >> 1);
        uVar5 = (ulong)((ndirect - uVar8) +
                       ((6 << (bVar1 & 0x1f)) + ((uVar4 & 1) << (bVar1 + 1 & 0x1f)) + -5 <<
                       (bVar2 & 0x1f)));
        uVar7 = ndirect + (uVar4 << (bVar2 & 0x1f) | ~uVar8) + 0x11;
      }
      uVar5 = (ulong)uVar7 | uVar5 << 0x20;
    }
    else {
      uVar5 = 0x7ffffffc8000000c;
    }
    sVar9 = uVar5 >> 0x20;
    uVar7 = ndirect + 0x10 + (0x3e << (bVar2 + 1 & 0x1f));
  }
  dist_params->alphabet_size_max = uVar7;
  dist_params->alphabet_size_limit = (uint32_t)uVar5;
  dist_params->max_distance = sVar9;
  return;
}

Assistant:

void duckdb_brotli::BrotliInitDistanceParams(BrotliDistanceParams* dist_params,
    uint32_t npostfix, uint32_t ndirect, BROTLI_BOOL large_window) {
  uint32_t alphabet_size_max;
  uint32_t alphabet_size_limit;
  uint32_t max_distance;

  dist_params->distance_postfix_bits = npostfix;
  dist_params->num_direct_distance_codes = ndirect;

  alphabet_size_max = BROTLI_DISTANCE_ALPHABET_SIZE(
      npostfix, ndirect, BROTLI_MAX_DISTANCE_BITS);
  alphabet_size_limit = alphabet_size_max;
  max_distance = ndirect + (1U << (BROTLI_MAX_DISTANCE_BITS + npostfix + 2)) -
      (1U << (npostfix + 2));

  if (large_window) {
    BrotliDistanceCodeLimit limit = BrotliCalculateDistanceCodeLimit(
        BROTLI_MAX_ALLOWED_DISTANCE, npostfix, ndirect);
    alphabet_size_max = BROTLI_DISTANCE_ALPHABET_SIZE(
        npostfix, ndirect, BROTLI_LARGE_MAX_DISTANCE_BITS);
    alphabet_size_limit = limit.max_alphabet_size;
    max_distance = limit.max_distance;
  }

  dist_params->alphabet_size_max = alphabet_size_max;
  dist_params->alphabet_size_limit = alphabet_size_limit;
  dist_params->max_distance = max_distance;
}